

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

FBaseCVar * cvar_forceset(char *var_name,char *val)

{
  FBaseCVar *this;
  UCVarValue vval;
  FBaseCVar *var;
  char *val_local;
  char *var_name_local;
  
  this = FindCVar(var_name,(FBaseCVar **)0x0);
  if (this != (FBaseCVar *)0x0) {
    FBaseCVar::ForceSet(this,(UCVarValue)val,CVAR_String,false);
  }
  return this;
}

Assistant:

FBaseCVar *cvar_forceset (const char *var_name, const char *val)
{
	FBaseCVar *var;
	UCVarValue vval;

	if ( (var = FindCVar (var_name, NULL)) )
	{
		vval.String = const_cast<char *>(val);
		var->ForceSet (vval, CVAR_String);
	}

	return var;
}